

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvparams_tests.cpp
# Opt level: O2

void __thiscall
iu_CsvParamsFloatTest_x_iutest_x_Param_Test::Body(iu_CsvParamsFloatTest_x_iutest_x_Param_Test *this)

{
  float fVar1;
  AssertionResult *ar;
  ParamType_conflict *pPVar2;
  float *in_R9;
  long lVar3;
  AssertionResult iutest_ar;
  iuCodeMessage local_208;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [392];
  
  local_198._0_8_ = local_198._0_8_ & 0xffffffff00000000;
  ar = (AssertionResult *)iutest::WithParamInterface<float>::GetParam();
  iutest::internal::CmpHelperNE<float,float>
            (&iutest_ar,(internal *)"0.0f","GetParam()",local_198,(float *)ar,in_R9);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/csvparams_tests.cpp"
               ,0x72,iutest_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_208,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  pPVar2 = iutest::WithParamInterface<float>::GetParam();
  local_198._0_8_ = &PTR__IMatcher_00143d40;
  local_198._8_4_ = *pPVar2;
  iutest::detail::ContainsMatcher<float>::operator()
            (&iutest_ar,(ContainsMatcher<float> *)local_198,&CsvParamsFloatTest::check_params);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    iutest::PrintToString<float[5]>(&local_1d8,&CsvParamsFloatTest::check_params);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_1b8,(detail *)local_1d8._M_dataplus._M_p,"Contains( GetParam() )",
               (char *)&iutest_ar,ar);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/csvparams_tests.cpp"
               ,0x74,local_1b8._M_dataplus._M_p);
    local_208._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_208,(Fixed *)local_198);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    std::__cxx11::string::~string((string *)&iutest_ar);
  }
  else {
    std::__cxx11::string::~string((string *)&iutest_ar);
    lVar3 = -1;
    do {
      if (lVar3 == 4) {
        return;
      }
      fVar1 = CsvParamsFloatTest::check_params[lVar3 + 1];
      pPVar2 = iutest::WithParamInterface<float>::GetParam();
      lVar3 = lVar3 + 1;
    } while ((fVar1 != *pPVar2) || (NAN(fVar1) || NAN(*pPVar2)));
    CsvParamsFloatTest::check_params[lVar3] = 0.0;
  }
  return;
}

Assistant:

IUTEST_P(CsvParamsFloatTest, Param)
{
    IUTEST_EXPECT_NE( 0.0f, GetParam() );
#if IUTEST_HAS_MATCHERS
    IUTEST_ASSERT_THAT( check_params, Contains( GetParam() ) );
#endif
    for( size_t i=0; i < IUTEST_PP_COUNTOF(check_params); ++i )
    {
        if( check_params[i] == GetParam() )
        {
            check_params[i] = 0.0f;
            break;
        }
    }
}